

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::getInfo1(btGeneric6DofConstraint *this,btConstraintInfo1 *info)

{
  bool bVar1;
  btTransform *pbVar2;
  int *in_RSI;
  btGeneric6DofConstraint *in_RDI;
  int i;
  btTransform *in_stack_00000070;
  btTransform *in_stack_00000078;
  btGeneric6DofConstraint *in_stack_00000080;
  int local_14;
  
  if ((in_RDI->m_useSolveConstraintObsolete & 1U) == 0) {
    pbVar2 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
    btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
    calculateTransforms(in_stack_00000080,in_stack_00000078,in_stack_00000070);
    *in_RSI = 0;
    in_RSI[1] = 6;
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      bVar1 = btTranslationalLimitMotor::needApplyForce(&in_RDI->m_linearLimits,local_14);
      if (bVar1) {
        *in_RSI = *in_RSI + 1;
        in_RSI[1] = in_RSI[1] + -1;
      }
    }
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      bVar1 = testAngularLimitMotor(in_RDI,(int)((ulong)pbVar2 >> 0x20));
      if (bVar1) {
        *in_RSI = *in_RSI + 1;
        in_RSI[1] = in_RSI[1] + -1;
      }
    }
  }
  else {
    *in_RSI = 0;
    in_RSI[1] = 0;
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo1 (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} else
	{
		//prepare constraint
		calculateTransforms(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());
		info->m_numConstraintRows = 0;
		info->nub = 6;
		int i;
		//test linear limits
		for(i = 0; i < 3; i++)
		{
			if(m_linearLimits.needApplyForce(i))
			{
				info->m_numConstraintRows++;
				info->nub--;
			}
		}
		//test angular limits
		for (i=0;i<3 ;i++ )
		{
			if(testAngularLimitMotor(i))
			{
				info->m_numConstraintRows++;
				info->nub--;
			}
		}
	}
}